

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdGetSupportedFunction_Test::~cfdcapi_common_CfdGetSupportedFunction_Test
          (cfdcapi_common_CfdGetSupportedFunction_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_common_CfdGetSupportedFunction_Test
            ((cfdcapi_common_CfdGetSupportedFunction_Test *)0x32c3b8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdGetSupportedFunction) {
  uint64_t functions = 0;
  int ret = CfdGetSupportedFunction(&functions);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(1,  functions & 0x01);

  ret = CfdGetSupportedFunction(NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);
}